

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::GetBitFieldName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int index)

{
  int i;
  string sStack_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"bitField",(allocator<char> *)&sStack_38);
  SimpleItoa_abi_cxx11_(&sStack_38,(protobuf *)((ulong)this & 0xffffffff),i);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string GetBitFieldName(int index) {
  string varName = "bitField";
  varName += SimpleItoa(index);
  varName += "_";
  return varName;
}